

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

string * __thiscall
wabt::(anonymous_namespace)::MakeDollarName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,string_view name)

{
  size_type *psVar1;
  undefined8 *puVar2;
  ulong uVar3;
  undefined8 uVar4;
  undefined1 local_70 [8];
  string_view name_local;
  ulong local_58;
  ulong local_50 [2];
  string local_40;
  
  name_local.data_ = name.data_;
  local_70 = (undefined1  [8])this;
  name_local.size_ = (size_type)local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&name_local.size_,"$","",name.size_);
  string_view::to_string_abi_cxx11_(&local_40,(string_view *)local_70);
  uVar3 = 0xf;
  if ((ulong *)name_local.size_ != local_50) {
    uVar3 = local_50[0];
  }
  if (uVar3 < local_40._M_string_length + local_58) {
    uVar4 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      uVar4 = local_40.field_2._M_allocated_capacity;
    }
    if (local_40._M_string_length + local_58 <= (ulong)uVar4) {
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace
                         ((string *)&local_40,0,0,(char *)name_local.size_,local_58);
      goto LAB_00f493df;
    }
  }
  puVar2 = (undefined8 *)
           std::__cxx11::string::_M_append
                     ((string *)&name_local.size_,local_40._M_dataplus._M_p,
                      local_40._M_string_length);
LAB_00f493df:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar2 + 2;
  if ((size_type *)*puVar2 == psVar1) {
    uVar4 = puVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar2[1];
  *puVar2 = psVar1;
  puVar2[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if ((ulong *)name_local.size_ != local_50) {
    operator_delete((void *)name_local.size_);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string MakeDollarName(string_view name) {
  return std::string("$") + name.to_string();
}